

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::SubroutineSymbol::inheritDefaultedArgList
          (SubroutineSymbol *this,Scope *scope,Scope *parentScope,SyntaxNode *syntax,
          SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *arguments)

{
  Symbol *pSVar1;
  __fn *__fn;
  SourceLocation this_00;
  size_t sVar2;
  pointer ppFVar3;
  FormalArgumentSymbol *this_01;
  int iVar4;
  SubroutineSymbol *pSVar5;
  Expression *this_02;
  undefined4 extraout_var;
  Diagnostic *this_03;
  SyntaxNode *pSVar6;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  ClassType *this_04;
  long lVar7;
  byte bVar8;
  SourceRange sourceRange;
  LocalVarCheckVisitor visitor;
  LocalVarCheckVisitor local_58;
  
  pSVar1 = scope->thisSym;
  if (pSVar1->kind == ClassType) {
    __fn = *(__fn **)&this->super_Symbol;
    pSVar6 = syntax;
    if (pSVar1[1].indexInScope != 0) {
      Scope::elaborate((Scope *)&pSVar1[1].name);
    }
    this_00 = pSVar1[2].location;
    if (this_00 == (SourceLocation)0x0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)parentScope);
      this_03 = Scope::addDiag((Scope *)this,(DiagCode)0x2f000a,sourceRange);
      Diagnostic::operator<<(this_03,pSVar1->name);
      return;
    }
    this_04 = *(ClassType **)((long)this_00 + 0x40);
    if (this_04 == (ClassType *)0x0) {
      Type::resolveCanonical((Type *)this_00);
      this_04 = *(ClassType **)((long)this_00 + 0x40);
    }
    if ((this_04->super_Type).super_Symbol.kind == ClassType) {
      pSVar5 = ClassType::getConstructor(this_04);
      if (pSVar5 != (SubroutineSymbol *)0x0) {
        if ((pSVar5->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&pSVar5->super_Scope);
        }
        sVar2 = (pSVar5->arguments)._M_extent._M_extent_value;
        if (sVar2 != 0) {
          ppFVar3 = (pSVar5->arguments)._M_ptr;
          lVar7 = 0;
          bVar8 = 0;
          do {
            this_01 = *(FormalArgumentSymbol **)((long)ppFVar3 + lVar7);
            this_02 = FormalArgumentSymbol::getDefaultValue(this_01);
            __child_stack = extraout_RDX;
            if (((this_02 != (Expression *)0x0) && ((bVar8 & 1) == 0)) &&
               (pSVar6 = (SyntaxNode *)
                         (this_01->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len,
               pSVar6 != (SyntaxNode *)0x0)) {
              local_58.argName._M_str =
                   (this_01->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
              local_58.anyErrors = false;
              local_58.scope = (Scope *)this;
              local_58.syntax = (SyntaxNode *)parentScope;
              local_58.argName._M_len = (size_t)pSVar6;
              Expression::
              visitExpression<slang::ast::Expression_const,slang::ast::LocalVarCheckVisitor&>
                        (this_02,this_02,&local_58);
              bVar8 = bVar8 | local_58.anyErrors;
              __child_stack = extraout_RDX_00;
            }
            iVar4 = FormalArgumentSymbol::clone(this_01,__fn,__child_stack,(int)pSVar6,arguments);
            pSVar6 = (SyntaxNode *)0x0;
            arguments = (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)0x1;
            Scope::insertMember((Scope *)this,(Symbol *)CONCAT44(extraout_var,iVar4),
                                (Symbol *)(this->super_Symbol).parentScope,false,true);
            local_58.scope = (Scope *)CONCAT44(extraout_var,iVar4);
            SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
            emplace_back<slang::ast::FormalArgumentSymbol_const*>
                      ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)syntax,
                       (FormalArgumentSymbol **)&local_58);
            lVar7 = lVar7 + 8;
          } while (sVar2 << 3 != lVar7);
        }
      }
    }
  }
  return;
}

Assistant:

void SubroutineSymbol::inheritDefaultedArgList(
    Scope& scope, const Scope& parentScope, const SyntaxNode& syntax,
    SmallVectorBase<const FormalArgumentSymbol*>& arguments) {

    auto& comp = scope.getCompilation();
    if (parentScope.asSymbol().kind == SymbolKind::ClassType) {
        auto& ct = parentScope.asSymbol().as<ClassType>();
        auto baseClass = ct.getBaseClass();
        if (!baseClass) {
            scope.addDiag(diag::SuperNoBase, syntax.sourceRange()) << ct.name;
        }
        else if (baseClass->isClass()) {
            // Note: we check isClass() above to skip over cases where
            // the baseClass is the ErrorType.
            auto& baseCt = baseClass->getCanonicalType().as<ClassType>();
            if (auto constructor = baseCt.getConstructor()) {
                // We found the base class's constructor.
                // Pull in all arguments from it.
                bool anyErrors = false;
                for (auto arg : constructor->getArguments()) {
                    // It's an error if any of the inherited arguments
                    // have default values that refer to local members
                    // of the parent class.
                    if (auto defVal = arg->getDefaultValue();
                        !anyErrors && defVal && !arg->name.empty()) {
                        LocalVarCheckVisitor visitor(scope, syntax, arg->name);
                        defVal->visit(visitor);
                        anyErrors |= visitor.anyErrors;
                    }

                    auto& cloned = arg->clone(comp);
                    scope.addMember(cloned);
                    arguments.push_back(&cloned);
                }
            }
        }
    }
}